

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pBlendTests.cpp
# Opt level: O3

int __thiscall deqp::gles2::Performance::BlendTests::init(BlendTests *this,EVP_PKEY_CTX *ctx)

{
  pointer pcVar1;
  Context *pCVar2;
  _func_int **pp_Var3;
  TestContext *pTVar4;
  int extraout_EAX;
  ShaderPerformanceCase *this_00;
  long lVar5;
  
  lVar5 = 0;
  do {
    this_00 = (ShaderPerformanceCase *)operator_new(0x1d8);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pp_Var3 = *(_func_int ***)((long)&init::cases[0].modeRGB + lVar5);
    pTVar4 = *(TestContext **)((long)&init::cases[0].srcRGB + lVar5);
    pcVar1 = *(pointer *)((long)&init::cases[0].srcAlpha + lVar5);
    deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
              (this_00,pCVar2->m_testCtx,pCVar2->m_renderCtx,
               *(char **)((long)&init::cases[0].name + lVar5),
               glcts::fixed_sample_locations_values + 1,CASETYPE_FRAGMENT);
    (this_00->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BlendCase_0212d000
    ;
    this_00[1].super_TestCase.super_TestNode._vptr_TestNode = pp_Var3;
    this_00[1].super_TestCase.super_TestNode.m_testCtx = pTVar4;
    this_00[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = pcVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x1a0);
  return extraout_EAX;
}

Assistant:

void BlendTests::init (void)
{
	static const struct
	{
		const char*	name;
		GLenum		modeRGB;
		GLenum		modeAlpha;
		GLenum		srcRGB;
		GLenum		dstRGB;
		GLenum		srcAlpha;
		GLenum		dstAlpha;
	} cases[] =
	{
		// Single blend func, factor one.
		{ "add",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE,		GL_ONE,		GL_ONE,		GL_ONE		},
		{ "subtract",					GL_FUNC_SUBTRACT,			GL_FUNC_SUBTRACT,			GL_ONE,		GL_ONE,		GL_ONE,		GL_ONE		},
		{ "reverse_subtract",			GL_FUNC_REVERSE_SUBTRACT,	GL_FUNC_REVERSE_SUBTRACT,	GL_ONE,		GL_ONE,		GL_ONE,		GL_ONE		},

		// Porter-duff modes that can be implemented.
		{ "dst_atop",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE_MINUS_DST_ALPHA,		GL_SRC_ALPHA,				GL_ONE,					GL_ZERO					},
		{ "dst_in",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ZERO,					GL_SRC_ALPHA,				GL_ZERO,				GL_SRC_ALPHA			},
		{ "dst_out",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ZERO,					GL_ONE_MINUS_SRC_ALPHA,		GL_ZERO,				GL_ONE_MINUS_SRC_ALPHA	},
		{ "dst_over",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE_MINUS_DST_ALPHA,		GL_ONE,						GL_ONE,					GL_ONE_MINUS_SRC_ALPHA	},
		{ "src_atop",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_DST_ALPHA,				GL_ONE_MINUS_SRC_ALPHA,		GL_ZERO,				GL_ONE					},
		{ "src_in",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_DST_ALPHA,				GL_ZERO,					GL_DST_ALPHA,			GL_ZERO					},
		{ "src_out",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE_MINUS_DST_ALPHA,		GL_ZERO,					GL_ONE_MINUS_DST_ALPHA,	GL_ZERO					},
		{ "src_over",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE,						GL_ONE_MINUS_SRC_ALPHA,		GL_ONE,					GL_ONE_MINUS_SRC_ALPHA	},
		{ "multiply",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_DST_COLOR,				GL_ZERO,					GL_DST_ALPHA,			GL_ZERO					},
		{ "screen",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE,						GL_ONE_MINUS_SRC_COLOR,		GL_ONE,					GL_ONE_MINUS_SRC_ALPHA	}
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		addChild(new BlendCase(m_context, cases[caseNdx].name, "", cases[caseNdx].modeRGB, cases[caseNdx].modeAlpha, cases[caseNdx].srcRGB, cases[caseNdx].dstRGB, cases[caseNdx].srcAlpha, cases[caseNdx].dstAlpha));
}